

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructAccessor
          (LobsterGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  Value *type;
  BaseType BVar1;
  EnumVal *__rhs;
  EnumDef *pEVar2;
  size_t sVar3;
  char *pcVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer ppEVar7;
  string defval;
  string acc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def;
  string offsets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  _Alloc_hider local_130;
  StructDef *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string *local_90;
  Value *local_88;
  FieldDef *local_80;
  LobsterGenerator *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"    ");
  NumToString<unsigned_short>(&local_b0,(field->value).offset);
  EscapeKeyword((string *)&local_130,this,(string *)field);
  std::operator+(&local_d0,"    def ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
  type = &field->value;
  std::__cxx11::string::~string((string *)&local_130);
  BVar1 = (type->type).base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    local_130._M_p = (pointer)&aStack_120;
    local_128 = (StructDef *)0x0;
    aStack_120._M_allocated_capacity = aStack_120._M_allocated_capacity & 0xffffffffffffff00;
    if (struct_def->fixed == true) {
      GenTypeName_abi_cxx11_(&local_110,this,&type->type);
      std::operator+(&local_150,"buf_.read_",&local_110);
      std::operator+(&local_170,&local_150,"_le(pos_ + ");
      std::operator+(&local_1b0,&local_170,&local_b0);
      std::operator+(&local_190,&local_1b0,")");
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      psVar5 = &local_110;
    }
    else {
      if (field->presence == kOptional) {
        pcVar4 = "0";
        if (BVar1 - BASE_TYPE_FLOAT < 2) {
          pcVar4 = "0.0";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,pcVar4,(allocator<char> *)&local_1b0);
      }
      else {
        std::__cxx11::string::string((string *)&local_190,(string *)&(field->value).constant);
      }
      GenTypeName_abi_cxx11_(&local_50,this,&type->type);
      std::operator+(&local_70,"flatbuffers.field_",&local_50);
      std::operator+(&local_f0,&local_70,"(buf_, pos_, ");
      std::operator+(&local_110,&local_f0,&local_b0);
      std::operator+(&local_150,&local_110,", ");
      std::operator+(&local_170,&local_150,&local_190);
      std::operator+(&local_1b0,&local_170,")");
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if ((type->type).base_type == BASE_TYPE_BOOL) {
        std::operator+(&local_170,"bool(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_130);
        std::operator+(&local_1b0,&local_170,")");
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
      }
      psVar5 = &local_190;
    }
    std::__cxx11::string::~string((string *)psVar5);
    pEVar2 = (field->value).type.enum_def;
    if (pEVar2 != (EnumDef *)0x0) {
      EscapeKeyword(&local_150,this,(string *)pEVar2);
      std::operator+(&local_170,&local_150,"(");
      std::operator+(&local_1b0,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130
                    );
      std::operator+(&local_190,&local_1b0,")");
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
    }
    if (field->presence == kOptional) {
      std::operator+(&local_1b0,", flatbuffers.field_present(buf_, pos_, ",&local_b0);
      std::operator+(&local_190,&local_1b0,")");
      std::__cxx11::string::append((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::operator+(&local_110,&local_d0,"() -> ");
      LobsterType_abi_cxx11_(&local_f0,this,&type->type);
      std::operator+(&local_150,&local_110,&local_f0);
      std::operator+(&local_170,&local_150,", bool:\n        return ");
      std::operator+(&local_1b0,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130
                    );
      std::operator+(&local_190,&local_1b0,"\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    else {
      std::operator+(&local_110,&local_d0,"() -> ");
      LobsterType_abi_cxx11_(&local_f0,this,&type->type);
      std::operator+(&local_150,&local_110,&local_f0);
      std::operator+(&local_170,&local_150,":\n        return ");
      std::operator+(&local_1b0,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130
                    );
      std::operator+(&local_190,&local_1b0,"\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
  }
  else {
    local_90 = code_ptr;
    local_88 = type;
    switch(BVar1) {
    case BASE_TYPE_STRING:
      std::operator+(&local_1b0,&local_d0,
                     "() -> string:\n        return flatbuffers.field_string(buf_, pos_, ");
      std::operator+(&local_190,&local_1b0,&local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130
                     ,&local_190,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_190);
      pbVar6 = &local_1b0;
      break;
    case BASE_TYPE_VECTOR:
      local_130._M_p._0_4_ = (field->value).type.element;
      aStack_120._8_2_ = (field->value).type.fixed_length;
      local_130._M_p._4_4_ = 0;
      local_128 = (field->value).type.struct_def;
      aStack_120._M_allocated_capacity = (size_type)(field->value).type.enum_def;
      if ((BaseType)local_130._M_p == BASE_TYPE_STRING) {
        std::operator+(&local_190,&local_d0,"(i:int) -> string:\n        return ");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::append((char *)code_ptr);
      }
      else {
        if ((BaseType)local_130._M_p == BASE_TYPE_STRUCT) {
          std::operator+(&local_170,"flatbuffers.field_vector(buf_, pos_, ",&local_b0);
          std::operator+(&local_1b0,&local_170,") + i * ");
          sVar3 = InlineSize((Type *)&local_130);
          NumToString<unsigned_long>(&local_150,sVar3);
          std::operator+(&local_190,&local_1b0,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_170);
          if (local_128->fixed == false) {
            std::operator+(&local_170,"flatbuffers.indirect(buf_, ",&local_190);
            std::operator+(&local_1b0,&local_170,")");
            std::__cxx11::string::operator=((string *)&local_190,(string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_170);
          }
          std::operator+(&local_150,&local_d0,"(i:int) -> ");
          NamespacedName_abi_cxx11_
                    (&local_110,this,&((field->value).type.struct_def)->super_Definition);
          std::operator+(&local_170,&local_150,&local_110);
          std::operator+(&local_1b0,&local_170,":\n        return ");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_150);
          NamespacedName_abi_cxx11_
                    (&local_110,this,&((field->value).type.struct_def)->super_Definition);
          std::operator+(&local_150,&local_110," { buf_, ");
          std::operator+(&local_170,&local_150,&local_190);
          std::operator+(&local_1b0,&local_170," }\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_110);
          pbVar6 = &local_190;
          break;
        }
        std::operator+(&local_170,&local_d0,"(i:int) -> ");
        LobsterType_abi_cxx11_(&local_150,this,(Type *)&local_130);
        std::operator+(&local_1b0,&local_170,&local_150);
        std::operator+(&local_190,&local_1b0,":\n        return ");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        GenTypeName_abi_cxx11_(&local_170,this,(Type *)&local_130);
        std::operator+(&local_1b0,"read_",&local_170);
        std::operator+(&local_190,&local_1b0,"_le");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
      }
      std::operator+(&local_150,"(buf_, buf_.flatbuffers.field_vector(pos_, ",&local_b0);
      std::operator+(&local_170,&local_150,") + i * ");
      sVar3 = InlineSize((Type *)&local_130);
      NumToString<unsigned_long>(&local_110,sVar3);
      std::operator+(&local_1b0,&local_170,&local_110);
      std::operator+(&local_190,&local_1b0,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_170);
      pbVar6 = &local_150;
      break;
    case BASE_TYPE_STRUCT:
      NamespacedName_abi_cxx11_
                ((string *)&local_130,this,&((field->value).type.struct_def)->super_Definition);
      if (struct_def->fixed == true) {
        std::operator+(&local_170,&local_d0,"() -> ");
        std::operator+(&local_1b0,&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_130);
        std::operator+(&local_190,&local_1b0,":\n        ");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
        std::operator+(&local_150,"return ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_130);
        std::operator+(&local_170,&local_150,"{ buf_, pos_ + ");
        std::operator+(&local_1b0,&local_170,&local_b0);
        std::operator+(&local_190,&local_1b0," }\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
        pbVar6 = &local_150;
      }
      else {
        std::operator+(&local_1b0,&local_d0,"() -> ");
        std::operator+(&local_190,&local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_130);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        if (field->presence != kRequired) {
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"let o = flatbuffers.field_",(allocator<char> *)&local_f0);
        pcVar4 = "table";
        if (((field->value).type.struct_def)->fixed != false) {
          pcVar4 = "struct";
        }
        std::operator+(&local_150,&local_110,pcVar4);
        std::operator+(&local_170,&local_150,"(buf_, pos_, ");
        std::operator+(&local_1b0,&local_170,&local_b0);
        std::operator+(&local_190,&local_1b0,")\n        return ");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_110);
        if (field->presence == kRequired) {
          std::operator+(&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_130," { buf_, assert o }\n");
          std::__cxx11::string::append((string *)code_ptr);
          pbVar6 = &local_190;
        }
        else {
          std::operator+(&local_1b0,"if o: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_130);
          std::operator+(&local_190,&local_1b0," { buf_, o } else: nil\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_190);
          pbVar6 = &local_1b0;
        }
      }
      std::__cxx11::string::~string((string *)pbVar6);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
      break;
    case BASE_TYPE_UNION:
      pEVar2 = (field->value).type.enum_def;
      local_80 = field;
      local_78 = this;
      for (ppEVar7 = (pEVar2->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppEVar7 !=
          (pEVar2->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
        __rhs = *ppEVar7;
        if (__rhs->value != 0) {
          std::operator+(&local_f0,&local_d0,"_as_");
          std::operator+(&local_110,&local_f0,&__rhs->name);
          std::operator+(&local_150,&local_110,"():\n        return ");
          NamespacedName_abi_cxx11_
                    (&local_70,local_78,&((__rhs->union_type).struct_def)->super_Definition);
          std::operator+(&local_170,&local_150,&local_70);
          std::operator+(&local_1b0,&local_170," { buf_, flatbuffers.field_table(buf_, pos_, ");
          std::operator+(&local_190,&local_1b0,&local_b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_130,&local_190,") }\n");
          std::__cxx11::string::append((string *)local_90);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_f0);
          pEVar2 = (local_80->value).type.enum_def;
        }
      }
      goto LAB_001f08a3;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_lobster.cpp"
                    ,0xd0,
                    "void flatbuffers::lobster::LobsterGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *)"
                   );
    }
    std::__cxx11::string::~string((string *)pbVar6);
LAB_001f08a3:
    BVar1 = (local_88->type).base_type;
    if ((BVar1 != BASE_TYPE_VECTOR64) && (BVar1 != BASE_TYPE_VECTOR)) goto LAB_001f093d;
    std::operator+(&local_1b0,&local_d0,
                   "_length() -> int:\n        return flatbuffers.field_vector_len(buf_, pos_, ");
    std::operator+(&local_190,&local_1b0,&local_b0);
    psVar5 = local_90;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_190,")\n");
    std::__cxx11::string::append((string *)psVar5);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_190);
    pbVar6 = &local_1b0;
  }
  std::__cxx11::string::~string((string *)pbVar6);
LAB_001f093d:
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, "    ");
    std::string &code = *code_ptr;
    auto offsets = NumToString(field.value.offset);
    auto def = "    def " + NormalizedName(field);
    if (IsScalar(field.value.type.base_type)) {
      std::string acc;
      if (struct_def.fixed) {
        acc = "buf_.read_" + GenTypeName(field.value.type) + "_le(pos_ + " +
              offsets + ")";

      } else {
        auto defval = field.IsOptional()
                          ? (IsFloat(field.value.type.base_type) ? "0.0" : "0")
                          : field.value.constant;
        acc = "flatbuffers.field_" + GenTypeName(field.value.type) +
              "(buf_, pos_, " + offsets + ", " + defval + ")";
        if (IsBool(field.value.type.base_type)) acc = "bool(" + acc + ")";
      }
      if (field.value.type.enum_def)
        acc = NormalizedName(*field.value.type.enum_def) + "(" + acc + ")";
      if (field.IsOptional()) {
        acc += ", flatbuffers.field_present(buf_, pos_, " + offsets + ")";
        code += def + "() -> " + LobsterType(field.value.type) +
                ", bool:\n        return " + acc + "\n";
      } else {
        code += def + "() -> " + LobsterType(field.value.type) +
                ":\n        return " + acc + "\n";
      }
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        auto name = NamespacedName(*field.value.type.struct_def);
        if (struct_def.fixed) {
          code += def + "() -> " + name + ":\n        ";
          code += "return " + name + "{ buf_, pos_ + " + offsets + " }\n";
        } else {
          code += def + "() -> " + name;
          if (!field.IsRequired()) code += "?";
          code += ":\n        ";
          code += std::string("let o = flatbuffers.field_") +
                  (field.value.type.struct_def->fixed ? "struct" : "table") +
                  "(buf_, pos_, " + offsets + ")\n        return ";
          if (field.IsRequired()) {
            code += name + " { buf_, assert o }\n";
          } else {
            code += "if o: " + name + " { buf_, o } else: nil\n";
          }
        }
        break;
      }
      case BASE_TYPE_STRING:
        code += def +
                "() -> string:\n        return "
                "flatbuffers.field_string(buf_, pos_, " +
                offsets + ")\n";
        break;
      case BASE_TYPE_VECTOR: {
        auto vectortype = field.value.type.VectorType();
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          auto start = "flatbuffers.field_vector(buf_, pos_, " + offsets +
                       ") + i * " + NumToString(InlineSize(vectortype));
          if (!(vectortype.struct_def->fixed)) {
            start = "flatbuffers.indirect(buf_, " + start + ")";
          }
          code += def + "(i:int) -> " +
                  NamespacedName(*field.value.type.struct_def) +
                  ":\n        return ";
          code += NamespacedName(*field.value.type.struct_def) + " { buf_, " +
                  start + " }\n";
        } else {
          if (IsString(vectortype)) {
            code += def + "(i:int) -> string:\n        return ";
            code += "flatbuffers.string";
          } else {
            code += def + "(i:int) -> " + LobsterType(vectortype) +
                    ":\n        return ";
            code += "read_" + GenTypeName(vectortype) + "_le";
          }
          code += "(buf_, buf_.flatbuffers.field_vector(pos_, " + offsets +
                  ") + i * " + NumToString(InlineSize(vectortype)) + ")\n";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        for (auto it = field.value.type.enum_def->Vals().begin();
             it != field.value.type.enum_def->Vals().end(); ++it) {
          auto &ev = **it;
          if (ev.IsNonZero()) {
            code += def + "_as_" + ev.name + "():\n        return " +
                    NamespacedName(*ev.union_type.struct_def) +
                    " { buf_, flatbuffers.field_table(buf_, pos_, " + offsets +
                    ") }\n";
          }
        }
        break;
      }
      default: FLATBUFFERS_ASSERT(0);
    }
    if (IsVector(field.value.type)) {
      code += def +
              "_length() -> int:\n        return "
              "flatbuffers.field_vector_len(buf_, pos_, " +
              offsets + ")\n";
    }
  }